

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O3

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Cell *target)

{
  S1ChordAngle SVar1;
  long lVar2;
  bool bVar3;
  int i;
  long lVar4;
  S2Point *a;
  long lVar5;
  S2Point *a_00;
  undefined4 uVar6;
  undefined4 uVar7;
  S2Point va [4];
  S2Point vb [4];
  S1ChordAngle local_118;
  S2Point local_110;
  S2Point local_f8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  S2Point local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->face_ == target->face_) {
    bVar3 = R2Rect::Intersects(&this->uv_,&target->uv_);
    if (bVar3) {
      S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_f8,0.0);
      uVar6 = SUB84(local_f8.c_[0],0);
      uVar7 = (undefined4)((ulong)local_f8.c_[0] >> 0x20);
      goto LAB_001d7403;
    }
  }
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_f8.c_[2] = 0.0;
  uStack_e0 = 0;
  local_f8.c_[0] = 0.0;
  local_f8.c_[1] = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_98.c_[2] = 0.0;
  uStack_80 = 0;
  local_98.c_[0] = 0.0;
  local_98.c_[1] = 0.0;
  lVar5 = 0;
  lVar4 = 0;
  do {
    GetVertex(&local_110,this,(int)lVar4);
    *(VType *)((long)local_f8.c_ + lVar5 + 0x10) = local_110.c_[2];
    *(VType *)((long)local_f8.c_ + lVar5) = local_110.c_[0];
    *(VType *)((long)local_f8.c_ + lVar5 + 8) = local_110.c_[1];
    GetVertex(&local_110,target,(int)lVar4);
    *(VType *)((long)local_98.c_ + lVar5 + 0x10) = local_110.c_[2];
    *(VType *)((long)local_98.c_ + lVar5) = local_110.c_[0];
    *(VType *)((long)local_98.c_ + lVar5 + 8) = local_110.c_[1];
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x18;
  } while (lVar4 != 4);
  S1ChordAngle::S1ChordAngle(&local_118,INFINITY);
  lVar4 = 0;
  do {
    lVar5 = 1;
    a = &local_98;
    a_00 = &local_f8;
    do {
      lVar2 = (ulong)(((uint)lVar5 & 3) << 3) * 3;
      S2::UpdateMinDistance(&local_f8 + lVar4,a,(S2Point *)((long)local_98.c_ + lVar2),&local_118);
      S2::UpdateMinDistance
                (&local_98 + lVar4,a_00,(S2Point *)((long)local_f8.c_ + lVar2),&local_118);
      a_00 = a_00 + 1;
      a = a + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar6 = SUB84(local_118.length2_,0);
  uVar7 = (undefined4)((ulong)local_118.length2_ >> 0x20);
LAB_001d7403:
  SVar1.length2_._4_4_ = uVar7;
  SVar1.length2_._0_4_ = uVar6;
  return (S1ChordAngle)SVar1.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Cell& target) const {
  // If the cells intersect, the distance is zero.  We use the (u,v) ranges
  // rather S2CellId::intersects() so that cells that share a partial edge or
  // corner are considered to intersect.
  if (face_ == target.face_ && uv_.Intersects(target.uv_)) {
    return S1ChordAngle::Zero();
  }

  // Otherwise, the minimum distance always occurs between a vertex of one
  // cell and an edge of the other cell (including the edge endpoints).  This
  // represents a total of 32 possible (vertex, edge) pairs.
  //
  // TODO(ericv): This could be optimized to be at least 5x faster by pruning
  // the set of possible closest vertex/edge pairs using the faces and (u,v)
  // ranges of both cells.
  S2Point va[4], vb[4];
  for (int i = 0; i < 4; ++i) {
    va[i] = GetVertex(i);
    vb[i] = target.GetVertex(i);
  }
  S1ChordAngle min_dist = S1ChordAngle::Infinity();
  for (int i = 0; i < 4; ++i) {
    for (int j = 0; j < 4; ++j) {
      S2::UpdateMinDistance(va[i], vb[j], vb[(j + 1) & 3], &min_dist);
      S2::UpdateMinDistance(vb[i], va[j], va[(j + 1) & 3], &min_dist);
    }
  }
  return min_dist;
}